

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<google::protobuf::Map<bool,proto2_unittest::Proto2MapEnum>,void>
               (Map<bool,_proto2_unittest::Proto2MapEnum> *container,ostream *os)

{
  bool bVar1;
  NodeBase *pNVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  uVar3 = (container->super_KeyMapBase<bool>).super_UntypedMapBase.index_of_first_non_null_;
  uVar4 = (ulong)uVar3;
  if (uVar3 == (container->super_KeyMapBase<bool>).super_UntypedMapBase.num_buckets_) {
    uVar4 = 0;
    pNVar2 = (NodeBase *)0x0;
  }
  else {
    pNVar2 = (container->super_KeyMapBase<bool>).super_UntypedMapBase.table_[uVar4];
    if (pNVar2 == (NodeBase *)0x0) {
      google::protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  if (pNVar2 != (NodeBase *)0x0) {
    lVar5 = 0;
    do {
      if ((lVar5 == 0) ||
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar5 != 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        PrintTo<bool_const,proto2_unittest::Proto2MapEnum>
                  ((pair<const_bool,_proto2_unittest::Proto2MapEnum> *)(pNVar2 + 1),os);
        lVar5 = lVar5 + 1;
        bVar1 = true;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar5 = 0x20;
        bVar1 = false;
      }
      if (!bVar1) break;
      pNVar2 = pNVar2->next;
      if (pNVar2 == (NodeBase *)0x0) {
        do {
          uVar3 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar3;
          if ((container->super_KeyMapBase<bool>).super_UntypedMapBase.num_buckets_ <= uVar3) {
            pNVar2 = (NodeBase *)0x0;
            uVar4 = 0;
            break;
          }
          pNVar2 = (container->super_KeyMapBase<bool>).super_UntypedMapBase.table_[uVar3];
        } while (pNVar2 == (NodeBase *)0x0);
      }
    } while (pNVar2 != (NodeBase *)0x0);
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }